

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_pointerLikeType_load(sysbvm_context_t *context,sysbvm_tuple_t pointerLikeValue)

{
  sysbvm_tuple_t *psVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uVar7;
  size_t typeTag;
  ulong immediateTypeTag;
  bool bVar8;
  bool bVar9;
  undefined8 local_60;
  sysbvm_tuple_t *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  if (pointerLikeValue == 0) {
    sysbvm_error("Accessing null pointer.");
  }
  bVar8 = pointerLikeValue == 0;
  immediateTypeTag = pointerLikeValue & 0xf;
  bVar9 = immediateTypeTag != 0;
  if (bVar9 || bVar8) {
    if ((int)immediateTypeTag == 0xf) {
      uVar5 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,pointerLikeValue >> 4);
    }
    else {
      uVar5 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
    }
  }
  else {
    uVar5 = *(ulong *)pointerLikeValue;
  }
  if (((uVar5 & 0xf) == 0 && uVar5 != 0) && ((*(byte *)(uVar5 + 8) & 0x80) == 0)) {
    uVar4 = *(ulong *)(uVar5 + 0x70);
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      uVar4 = (long)uVar4 >> 4;
    }
    else {
      uVar4 = *(ulong *)(uVar4 + 0x10);
    }
  }
  else {
    uVar4 = 0;
  }
  if ((uVar4 & 0xe00) == 0) {
    _Var2 = sysbvm_tuple_isKindOf(context,uVar5,(context->roots).valueType);
    if (_Var2) {
      return pointerLikeValue;
    }
    sysbvm_error("Expected a pointer like value.");
  }
  if (bVar9 || bVar8) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(uint *)(pointerLikeValue + 0xc) >> 3;
  }
  if (uVar6 == 0) {
    sysbvm_error("Expected a pointer like value with at least single slot.");
  }
  psVar1 = *(sysbvm_tuple_t **)(pointerLikeValue + 0x10);
  if (uVar6 < 2) {
    uVar7 = 0xc;
    local_60 = 0;
  }
  else {
    local_60 = *(undefined8 *)(pointerLikeValue + 0x18);
    if (uVar6 == 2) {
      uVar7 = 0xc;
    }
    else {
      uVar7 = *(undefined8 *)(pointerLikeValue + 0x20);
    }
  }
  uVar5 = (ulong)psVar1 & 0xf;
  if (uVar5 == 0 && psVar1 != (sysbvm_tuple_t *)0x0) {
    sVar3 = *psVar1;
  }
  else if ((int)uVar5 == 0xf) {
    sVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar1 >> 4);
  }
  else {
    sVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar5);
  }
  if (sVar3 == (context->roots).valueBoxType) {
    sVar3 = psVar1[2];
  }
  else {
    if (bVar9 || bVar8) {
      if ((int)immediateTypeTag == 0xf) {
        sVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,pointerLikeValue >> 4);
      }
      else {
        sVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
      }
    }
    else {
      sVar3 = *(sysbvm_tuple_t *)pointerLikeValue;
    }
    local_40 = *(undefined8 *)(sVar3 + 0xf8);
    local_50 = local_60;
    local_58 = psVar1;
    local_48 = uVar7;
    sVar3 = sysbvm_tuple_send(context,(context->roots).loadFromAtOffsetWithTypeSelector,4,
                              (sysbvm_tuple_t *)&local_58,0);
  }
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_pointerLikeType_load(sysbvm_context_t *context, sysbvm_tuple_t pointerLikeValue)
{
    if(!pointerLikeValue)
        sysbvm_error("Accessing null pointer.");
    sysbvm_tuple_t valueType = sysbvm_tuple_getType(context, pointerLikeValue);
    if(!sysbvm_type_isPointerLikeType(valueType))
    {
        // HACK: Allow treating the value types as pointers to themselves.
        if(sysbvm_tuple_isKindOf(context, valueType, context->roots.valueType))
            return pointerLikeValue;

        sysbvm_error("Expected a pointer like value.");
    }

    size_t slotCount = sysbvm_tuple_getSizeInSlots(pointerLikeValue);
    if(slotCount == 0)
        sysbvm_error("Expected a pointer like value with at least single slot.");

    sysbvm_object_tuple_t *pointerObject = (sysbvm_object_tuple_t*)pointerLikeValue;
    sysbvm_tuple_t storage = pointerObject->pointers[0];
    sysbvm_tuple_t base = SYSBVM_NULL_TUPLE;
    intptr_t offset = sysbvm_tuple_intptr_encode(context, 0);
    if(slotCount >= 2)
    {
        base = pointerObject->pointers[1];
        if(slotCount >= 3)
            offset = pointerObject->pointers[2];
    }

    if(sysbvm_tuple_getType(context, storage) == context->roots.valueBoxType)
        return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(storage)->pointers[0];

    sysbvm_pointerLikeType_t *pointerLikeType = (sysbvm_pointerLikeType_t*)sysbvm_tuple_getType(context, pointerLikeValue);
    return sysbvm_tuple_send3(context, context->roots.loadFromAtOffsetWithTypeSelector, storage, base, offset, pointerLikeType->baseType);
}